

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O1

long TimeInMillisImplementation(void)

{
  timezone tz;
  timeval tv;
  timezone local_20;
  timeval local_18;
  
  gettimeofday(&local_18,&local_20);
  return (long)((double)local_18.tv_usec * 0.001) + local_18.tv_sec * 1000;
}

Assistant:

static long TimeInMillisImplementation()
{
#ifdef CPPUTEST_HAVE_GETTIMEOFDAY
    struct timeval tv;
    struct timezone tz;
    gettimeofday(&tv, &tz);
    return (long)((tv.tv_sec * 1000) + (time_t)((double)tv.tv_usec * 0.001));
#else
    return 0;
#endif
}